

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O1

void __thiscall
google::protobuf::internal::ArenaStringPtr::InitAllocated
          (ArenaStringPtr *this,string *str,Arena *arena)

{
  Nonnull<const_char_*> pcVar1;
  ArenaStringPtr *v1;
  ArenaStringPtr *v1_00;
  ThreadSafeArena *unaff_R15;
  ArenaStringPtr aAStack_28 [2];
  
  v1 = aAStack_28;
  v1_00 = aAStack_28;
  if (arena == (Arena *)0x0) {
    if (str == (string *)0x0) {
      InitAllocated(aAStack_28);
LAB_00142d49:
      pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                         ((unsigned_long)v1_00,0,"reinterpret_cast<uintptr_t>(p) & kMask == 0UL");
    }
    else {
      v1_00 = (ArenaStringPtr *)((ulong)str & 3);
      if (v1_00 != (ArenaStringPtr *)0x0) goto LAB_00142d49;
      pcVar1 = (Nonnull<const_char_*>)0x0;
    }
    if (pcVar1 == (Nonnull<const_char_*>)0x0) {
      (this->tagged_ptr_).ptr_ = (void *)((ulong)str | 2);
      return;
    }
    goto LAB_00142d64;
  }
  if (str == (string *)0x0) {
    InitAllocated(aAStack_28);
LAB_00142d31:
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((unsigned_long)v1,0,"reinterpret_cast<uintptr_t>(p) & kMask == 0UL");
  }
  else {
    v1 = (ArenaStringPtr *)((ulong)str & 3);
    unaff_R15 = &arena->impl_;
    if (v1 != (ArenaStringPtr *)0x0) goto LAB_00142d31;
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    (this->tagged_ptr_).ptr_ = (void *)((ulong)str | 3);
    ThreadSafeArena::AddCleanup(unaff_R15,str,arena_delete_object<std::__cxx11::string>);
    return;
  }
  InitAllocated();
LAB_00142d64:
  InitAllocated();
}

Assistant:

inline void ArenaStringPtr::InitAllocated(std::string* str, Arena* arena) {
  if (arena != nullptr) {
    tagged_ptr_.SetMutableArena(str);
    arena->Own(str);
  } else {
    tagged_ptr_.SetAllocated(str);
  }
}